

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O3

void send_tree(deflate_state *s,ct_data *tree,int max_code)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  
  uVar7 = s->bi_valid;
  uVar6 = s->bi_buf;
  if (-1 < max_code) {
    uVar1 = (tree->dl).dad;
    uVar4 = 7;
    if (uVar1 == 0) {
      uVar4 = 0x8a;
    }
    iVar11 = (uVar1 != 0) + 3;
    uVar10 = 0;
    uVar13 = 0xffffffff;
    uVar12 = 0;
    uVar8 = (uint)uVar1;
    do {
      uVar1 = tree[uVar10 + 1].dl.dad;
      uVar9 = (uint)uVar1;
      uVar14 = uVar12 + 1;
      if (((int)uVar4 <= (int)uVar14) || (uVar8 != uVar9)) {
        uVar15 = uVar6;
        if ((int)uVar14 < iVar11) {
          do {
            uVar2 = s->bl_tree[uVar8].fc.freq;
            uVar6 = (ulong)uVar2;
            uVar13 = (uint)s->bl_tree[uVar8].dl.dad;
            uVar4 = uVar7 + uVar13;
            bVar5 = (byte)uVar7;
            if ((uVar4 | uVar7) < 0x40) {
              uVar6 = uVar6 << (bVar5 & 0x3f) | uVar15;
              uVar7 = uVar4;
            }
            else if (uVar7 < 0x40) {
              *(ulong *)(s->pending_buf + s->pending) = uVar6 << (bVar5 & 0x3f) | uVar15;
              s->pending = s->pending + 8;
              uVar6 = (ulong)(uVar2 >> (-bVar5 & 0x3f));
              uVar7 = uVar4 - 0x40;
            }
            else {
              *(ulong *)(s->pending_buf + s->pending) = uVar15;
              s->pending = s->pending + 8;
              uVar7 = uVar13;
            }
            uVar14 = uVar14 - 1;
            uVar15 = uVar6;
          } while (uVar14 != 0);
        }
        else {
          bVar5 = (byte)uVar7;
          if (uVar8 == 0) {
            if ((int)uVar12 < 10) {
              uVar2 = s->bl_tree[0x11].fc.freq;
              uVar15 = (ulong)uVar2;
              uVar13 = (uint)s->bl_tree[0x11].dl.dad;
              uVar4 = uVar7 + uVar13;
              if ((uVar4 | uVar7) < 0x40) {
                uVar15 = uVar15 << (bVar5 & 0x3f) | uVar6;
                uVar13 = uVar4;
              }
              else if (uVar7 < 0x40) {
                *(ulong *)(s->pending_buf + s->pending) = uVar15 << (bVar5 & 0x3f) | uVar6;
                s->pending = s->pending + 8;
                uVar15 = (ulong)(uVar2 >> (-bVar5 & 0x3f));
                uVar13 = uVar4 - 0x40;
              }
              else {
                *(ulong *)(s->pending_buf + s->pending) = uVar6;
                s->pending = s->pending + 8;
              }
              uVar6 = (long)(int)uVar12 - 2;
              uVar7 = uVar13 + 3;
              if ((uVar7 | uVar13) < 0x40) {
LAB_001383bb:
                bVar5 = (byte)uVar13;
                goto LAB_001383bd;
              }
              if (uVar13 < 0x40) {
                *(ulong *)(s->pending_buf + s->pending) = uVar6 << ((byte)uVar13 & 0x3f) | uVar15;
                s->pending = s->pending + 8;
                uVar6 = uVar6 >> (-(byte)uVar13 & 0x3f);
                uVar7 = uVar13 - 0x3d;
              }
              else {
                *(ulong *)(s->pending_buf + s->pending) = uVar15;
                s->pending = s->pending + 8;
                uVar7 = 3;
              }
            }
            else {
              uVar2 = s->bl_tree[0x12].fc.freq;
              uVar15 = (ulong)uVar2;
              uVar13 = (uint)s->bl_tree[0x12].dl.dad;
              uVar4 = uVar7 + uVar13;
              if ((uVar4 | uVar7) < 0x40) {
                uVar15 = uVar15 << (bVar5 & 0x3f) | uVar6;
                uVar13 = uVar4;
              }
              else if (uVar7 < 0x40) {
                *(ulong *)(s->pending_buf + s->pending) = uVar15 << (bVar5 & 0x3f) | uVar6;
                s->pending = s->pending + 8;
                uVar15 = (ulong)(uVar2 >> (-bVar5 & 0x3f));
                uVar13 = uVar4 - 0x40;
              }
              else {
                *(ulong *)(s->pending_buf + s->pending) = uVar6;
                s->pending = s->pending + 8;
              }
              uVar6 = (ulong)uVar12 - 10;
              uVar7 = uVar13 + 7;
              if ((uVar7 | uVar13) < 0x40) goto LAB_001383bb;
              if (uVar13 < 0x40) {
                *(ulong *)(s->pending_buf + s->pending) = uVar6 << ((byte)uVar13 & 0x3f) | uVar15;
                s->pending = s->pending + 8;
                uVar6 = uVar6 >> (-(byte)uVar13 & 0x3f);
                uVar7 = uVar13 - 0x39;
              }
              else {
                *(ulong *)(s->pending_buf + s->pending) = uVar15;
                s->pending = s->pending + 8;
                uVar7 = 7;
              }
            }
          }
          else {
            if (uVar8 != uVar13) {
              uVar2 = s->bl_tree[uVar8].fc.freq;
              uVar15 = (ulong)uVar2;
              uVar13 = (uint)s->bl_tree[uVar8].dl.dad;
              uVar4 = uVar7 + uVar13;
              uVar14 = uVar12;
              if ((uVar4 | uVar7) < 0x40) {
                uVar6 = uVar15 << (bVar5 & 0x3f) | uVar6;
                uVar7 = uVar4;
              }
              else if (uVar7 < 0x40) {
                *(ulong *)(s->pending_buf + s->pending) = uVar15 << (bVar5 & 0x3f) | uVar6;
                s->pending = s->pending + 8;
                uVar6 = (ulong)(uVar2 >> (-bVar5 & 0x3f));
                uVar7 = uVar4 - 0x40;
              }
              else {
                *(ulong *)(s->pending_buf + s->pending) = uVar6;
                s->pending = s->pending + 8;
                uVar6 = uVar15;
                uVar7 = uVar13;
              }
            }
            uVar2 = s->bl_tree[0x10].fc.freq;
            uVar15 = (ulong)uVar2;
            uVar3 = s->bl_tree[0x10].dl.dad;
            uVar4 = uVar7 + uVar3;
            bVar5 = (byte)uVar7;
            if ((uVar4 | uVar7) < 0x40) {
              uVar15 = uVar15 << (bVar5 & 0x3f) | uVar6;
            }
            else if (uVar7 < 0x40) {
              *(ulong *)(s->pending_buf + s->pending) = uVar15 << (bVar5 & 0x3f) | uVar6;
              s->pending = s->pending + 8;
              uVar15 = (ulong)(uVar2 >> (-bVar5 & 0x3f));
              uVar4 = uVar4 - 0x40;
            }
            else {
              *(ulong *)(s->pending_buf + s->pending) = uVar6;
              s->pending = s->pending + 8;
              uVar4 = (uint)uVar3;
            }
            uVar6 = (long)(int)uVar14 - 3;
            uVar7 = uVar4 + 2;
            bVar5 = (byte)uVar4;
            if ((uVar7 | uVar4) < 0x40) {
LAB_001383bd:
              uVar6 = uVar6 << (bVar5 & 0x3f) | uVar15;
            }
            else if (uVar4 < 0x40) {
              *(ulong *)(s->pending_buf + s->pending) = uVar6 << (bVar5 & 0x3f) | uVar15;
              s->pending = s->pending + 8;
              uVar6 = uVar6 >> (-bVar5 & 0x3f);
              uVar7 = uVar4 - 0x3e;
            }
            else {
              *(ulong *)(s->pending_buf + s->pending) = uVar15;
              s->pending = s->pending + 8;
              uVar7 = 2;
            }
          }
        }
        uVar14 = 0;
        uVar13 = uVar8;
        if (uVar1 == 0) {
          uVar4 = 0x8a;
          iVar11 = 3;
        }
        else {
          iVar11 = 4 - (uint)(uVar8 == uVar9);
          uVar4 = uVar8 == uVar9 ^ 7;
        }
      }
      uVar12 = uVar14;
      uVar10 = uVar10 + 1;
      uVar8 = uVar9;
    } while (uVar10 != max_code + 1);
  }
  s->bi_buf = uVar6;
  s->bi_valid = uVar7;
  return;
}

Assistant:

static void send_tree(deflate_state *s, ct_data *tree, int max_code) {
    /* tree: the tree to be scanned */
    /* max_code and its largest code of non zero frequency */
    int n;                     /* iterates over all tree elements */
    int prevlen = -1;          /* last emitted length */
    int curlen;                /* length of current code */
    int nextlen = tree[0].Len; /* length of next code */
    int count = 0;             /* repeat count of the current code */
    int max_count = 7;         /* max repeat count */
    int min_count = 4;         /* min repeat count */

    /* tree[max_code+1].Len = -1; */  /* guard already set */
    if (nextlen == 0)
        max_count = 138, min_count = 3;

    // Temp local variables
    uint32_t bi_valid = s->bi_valid;
    uint64_t bi_buf = s->bi_buf;

    for (n = 0; n <= max_code; n++) {
        curlen = nextlen;
        nextlen = tree[n+1].Len;
        if (++count < max_count && curlen == nextlen) {
            continue;
        } else if (count < min_count) {
            do {
                send_code(s, curlen, s->bl_tree, bi_buf, bi_valid);
            } while (--count != 0);

        } else if (curlen != 0) {
            if (curlen != prevlen) {
                send_code(s, curlen, s->bl_tree, bi_buf, bi_valid);
                count--;
            }
            Assert(count >= 3 && count <= 6, " 3_6?");
            send_code(s, REP_3_6, s->bl_tree, bi_buf, bi_valid);
            send_bits(s, count-3, 2, bi_buf, bi_valid);

        } else if (count <= 10) {
            send_code(s, REPZ_3_10, s->bl_tree, bi_buf, bi_valid);
            send_bits(s, count-3, 3, bi_buf, bi_valid);

        } else {
            send_code(s, REPZ_11_138, s->bl_tree, bi_buf, bi_valid);
            send_bits(s, count-11, 7, bi_buf, bi_valid);
        }
        count = 0;
        prevlen = curlen;
        if (nextlen == 0) {
            max_count = 138, min_count = 3;
        } else if (curlen == nextlen) {
            max_count = 6, min_count = 3;
        } else {
            max_count = 7, min_count = 4;
        }
    }

    // Store back temp variables
    s->bi_buf = bi_buf;
    s->bi_valid = bi_valid;
}